

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::(anonymous_namespace)::readOrder<short,int,rr::(anonymous_namespace)::NormalOrder>
               (Vector<int,_4> *dst,int size,void *ptr)

{
  int *piVar1;
  short local_28;
  short local_26;
  short local_24;
  short local_22;
  short aligned [4];
  void *ptr_local;
  int size_local;
  Vector<int,_4> *dst_local;
  
  aligned = (short  [4])ptr;
  ::deMemcpy(&local_28,ptr,(long)size << 1);
  piVar1 = tcu::Vector<int,_4>::operator[](dst,0);
  *piVar1 = (int)local_28;
  if (1 < size) {
    piVar1 = tcu::Vector<int,_4>::operator[](dst,1);
    *piVar1 = (int)local_26;
  }
  if (2 < size) {
    piVar1 = tcu::Vector<int,_4>::operator[](dst,2);
    *piVar1 = (int)local_24;
  }
  if (3 < size) {
    piVar1 = tcu::Vector<int,_4>::operator[](dst,3);
    *piVar1 = (int)local_22;
  }
  return;
}

Assistant:

inline void readOrder (typename tcu::Vector<DstScalarType, 4>& dst, const int size, const void* ptr)
{
	SrcScalarType aligned[4];
	deMemcpy(aligned, ptr, size * sizeof(SrcScalarType));

				   dst[Order::T0] = DstScalarType(aligned[0]);
	if (size >= 2) dst[Order::T1] = DstScalarType(aligned[1]);
	if (size >= 3) dst[Order::T2] = DstScalarType(aligned[2]);
	if (size >= 4) dst[Order::T3] = DstScalarType(aligned[3]);
}